

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5DecodeLocaleValue
              (sqlite3_value *pVal,char **ppText,int *pnText,char **ppLoc,int *pnLoc)

{
  int iVar1;
  void *pvVar2;
  long *in_RCX;
  int *in_RDX;
  long *in_RSI;
  int *in_R8;
  int nLoc;
  int n;
  char *p;
  int local_40;
  sqlite3_value *in_stack_ffffffffffffffc8;
  
  pvVar2 = sqlite3_value_blob(in_stack_ffffffffffffffc8);
  iVar1 = sqlite3_value_bytes((sqlite3_value *)0x26cb56);
  local_40 = 0x10;
  while( true ) {
    if (*(char *)((long)pvVar2 + (long)local_40) == '\0') {
      *in_RCX = (long)pvVar2 + 0x10;
      *in_R8 = local_40 + -0x10;
      *in_RSI = (long)pvVar2 + (long)(local_40 + 1);
      *in_RDX = (iVar1 - local_40) + -1;
      return 0;
    }
    if (local_40 == iVar1 + -1) break;
    local_40 = local_40 + 1;
  }
  return 0x14;
}

Assistant:

static int sqlite3Fts5DecodeLocaleValue(
  sqlite3_value *pVal,
  const char **ppText,
  int *pnText,
  const char **ppLoc,
  int *pnLoc
){
  const char *p = sqlite3_value_blob(pVal);
  int n = sqlite3_value_bytes(pVal);
  int nLoc = 0;

  assert( sqlite3_value_type(pVal)==SQLITE_BLOB );
  assert( n>FTS5_LOCALE_HDR_SIZE );

  for(nLoc=FTS5_LOCALE_HDR_SIZE; p[nLoc]; nLoc++){
    if( nLoc==(n-1) ){
      return SQLITE_MISMATCH;
    }
  }
  *ppLoc = &p[FTS5_LOCALE_HDR_SIZE];
  *pnLoc = nLoc - FTS5_LOCALE_HDR_SIZE;

  *ppText = &p[nLoc+1];
  *pnText = n - nLoc - 1;
  return SQLITE_OK;
}